

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  uint uVar1;
  Rep *pRVar2;
  size_type sVar3;
  int iVar4;
  int n;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  void **ppvVar14;
  
  uVar9 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar9;
  uVar10 = uVar5;
  if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      lVar11 = *(long *)((long)((this->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                               [uVar8] + 8);
      uVar9 = (uint)lVar11 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar10 = uVar10 + lVar11 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  lVar13 = (long)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = uVar10 + lVar13;
  pRVar2 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar12 = 0;
    do {
      sVar6 = DescriptorProto::ByteSizeLong(*(DescriptorProto **)((long)ppvVar14 + lVar12));
      uVar9 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar12 = lVar12 + 8;
    } while (lVar13 * 8 != lVar12);
  }
  lVar13 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar13;
  pRVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar12 = 0;
    do {
      sVar6 = EnumDescriptorProto::ByteSizeLong(*(EnumDescriptorProto **)((long)ppvVar14 + lVar12));
      uVar9 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar12 = lVar12 + 8;
    } while (lVar13 * 8 != lVar12);
  }
  lVar13 = (long)(this->service_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar13;
  pRVar2 = (this->service_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar12 = 0;
    do {
      sVar6 = ServiceDescriptorProto::ByteSizeLong
                        (*(ServiceDescriptorProto **)((long)ppvVar14 + lVar12));
      uVar9 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar12 = lVar12 + 8;
    } while (lVar13 * 8 != lVar12);
  }
  lVar13 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar11 = lVar11 + lVar13;
  pRVar2 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar12 = 0;
    do {
      sVar6 = FieldDescriptorProto::ByteSizeLong
                        (*(FieldDescriptorProto **)((long)ppvVar14 + lVar12));
      uVar9 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar11 = lVar11 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar12 = lVar12 + 8;
    } while (lVar13 * 8 != lVar12);
  }
  sVar6 = internal::WireFormatLite::Int32Size(&this->public_dependency_);
  uVar9 = (this->public_dependency_).current_size_;
  sVar7 = internal::WireFormatLite::Int32Size(&this->weak_dependency_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  sVar6 = uVar9 + sVar6 + sVar7 + (ulong)(uint)(this->weak_dependency_).current_size_ + lVar11;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->name_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = sVar6 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = ((this->package_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = sVar6 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = ((this->syntax_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = sVar6 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar7 = FileOptions::ByteSizeLong(this->options_);
      uVar9 = (uint)sVar7 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar7 = SourceCodeInfo::ByteSizeLong(this->source_code_info_);
      uVar9 = (uint)sVar7 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar6 = sVar6 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    sVar6 = internal::ComputeUnknownFieldsSize
                      (&this->_internal_metadata_,sVar6,&this->_cached_size_);
    return sVar6;
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar6;
  return sVar6;
}

Assistant:

size_t FileDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string dependency = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(dependency_.size());
  for (int i = 0, n = dependency_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      dependency_.Get(i));
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1UL * this->_internal_message_type_size();
  for (const auto& msg : this->message_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1UL * this->_internal_service_size();
  for (const auto& msg : this->service_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated int32 public_dependency = 10;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->public_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_public_dependency_size());
    total_size += data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->weak_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_weak_dependency_size());
    total_size += data_size;
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string package = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_package());
    }

    // optional string syntax = 12;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_syntax());
    }

    // optional .google.protobuf.FileOptions options = 8;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *source_code_info_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}